

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QWizardDefaultProperty>::copyAppend
          (QGenericArrayOps<QWizardDefaultProperty> *this,QWizardDefaultProperty *b,
          QWizardDefaultProperty *e)

{
  qsizetype *pqVar1;
  QWizardDefaultProperty *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QWizardDefaultProperty>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QWizardDefaultProperty>).size;
      pDVar4 = (b->className).d.d;
      pQVar2[lVar3].className.d.d = pDVar4;
      pQVar2[lVar3].className.d.ptr = (b->className).d.ptr;
      pQVar2[lVar3].className.d.size = (b->className).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (b->property).d.d;
      pQVar2[lVar3].property.d.d = pDVar4;
      pQVar2[lVar3].property.d.ptr = (b->property).d.ptr;
      pQVar2[lVar3].property.d.size = (b->property).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->changedSignal).d.d;
      pQVar2[lVar3].changedSignal.d.d = pDVar4;
      pQVar2[lVar3].changedSignal.d.ptr = (b->changedSignal).d.ptr;
      pQVar2[lVar3].changedSignal.d.size = (b->changedSignal).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QWizardDefaultProperty>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }